

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cal_energy.cpp
# Opt level: O3

void Clash_detection_list
               (Structure *conf,vector<int,_std::allocator<int>_> *starts,
               vector<int,_std::allocator<int>_> *ends,vector<int,_std::allocator<int>_> *ResIdx,
               vector<int,_std::allocator<int>_> *ClashNum,vector<int,_std::allocator<int>_> *List)

{
  double *pdVar1;
  short sVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Atom *pAVar7;
  iterator iVar8;
  vector<int,std::allocator<int>> *this;
  short sVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  Atom *pAVar13;
  long lVar14;
  short sVar15;
  short sVar16;
  long lVar17;
  short sVar18;
  int iVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  int clash_count;
  int local_f0;
  uint local_ec;
  Residue *local_e8;
  pointer local_e0;
  Residue *local_d8;
  ulong local_d0;
  Residue *local_c8;
  Residue *local_c0;
  Atom *local_b8;
  long local_b0;
  double *local_a8;
  ulong local_a0;
  vector<int,_std::allocator<int>_> *local_98;
  vector<int,_std::allocator<int>_> *local_90;
  vector<int,_std::allocator<int>_> *local_88;
  vector<int,std::allocator<int>> *local_80;
  Structure *local_78;
  vector<int,std::allocator<int>> *local_70;
  ulong local_68;
  Atom *local_60;
  pointer local_58;
  ulong local_50;
  pointer local_48;
  ulong local_40;
  ulong local_38;
  
  local_a0 = (ulong)((long)(starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  if (0 < (int)local_a0) {
    local_68 = (ulong)((long)(List->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(List->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 2;
    local_a0 = local_a0 & 0x7fffffff;
    local_e0 = (ends->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
    local_50 = local_68 & 0x7fffffff;
    uVar12 = 0;
    local_98 = List;
    local_90 = starts;
    local_88 = ends;
    local_80 = (vector<int,std::allocator<int>> *)ResIdx;
    local_78 = conf;
    local_70 = (vector<int,std::allocator<int>> *)ClashNum;
    do {
      uVar10 = (local_90->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar12];
      local_d0 = uVar12;
      if ((int)uVar10 <= local_e0[uVar12]) {
        do {
          this = local_70;
          local_f0 = 0;
          local_40 = (ulong)uVar10;
          local_d8 = conf->_res;
          sVar2 = local_d8[(int)uVar10]._type;
          local_ec = uVar10;
          if ((sVar2 != 0) && (sVar2 != 5)) {
            if (0 < (int)local_68) {
              local_48 = (local_98->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
              local_58 = (local_90->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
              local_60 = &local_d8[(int)uVar10]._center;
              local_c8 = local_d8 + (int)uVar10;
              iVar19 = 0;
              uVar12 = 0;
              sVar15 = sVar2;
              sVar16 = sVar2;
              sVar9 = sVar2;
              sVar18 = sVar2;
              do {
                local_38 = uVar12;
                uVar4 = local_48[local_38];
                lVar11 = (long)(int)uVar4;
                if (uVar4 == uVar10) {
                  if (6 < (long)local_c8->_numAtom) {
                    pAVar13 = local_c8->_atom;
                    lVar11 = 6;
                    do {
                      if (pAVar13[lVar11]._type < 0x16 && pAVar13[lVar11]._type != -0x3039) {
                        pAVar7 = pAVar13 + lVar11;
                        dVar22 = (pAVar7->super_Point).x;
                        if (((dVar22 != 0.0) || (NAN(dVar22))) ||
                           ((dVar22 = (pAVar7->super_Point).y, dVar22 != 0.0 ||
                            (((NAN(dVar22) || (dVar22 = (pAVar7->super_Point).z, dVar22 != 0.0)) ||
                             (NAN(dVar22))))))) {
                          lVar14 = 0;
                          do {
                            iVar5 = *(int *)((long)&pAVar13[2]._type + lVar14);
                            if (iVar5 < 0x16 && iVar5 != -0x3039) {
                              dVar22 = *(double *)((long)&pAVar13[2].super_Point.x + lVar14);
                              dVar23 = *(double *)((long)&pAVar13[2].super_Point.y + lVar14);
                              if ((((dVar22 != 0.0) || (NAN(dVar22))) ||
                                  (((dVar23 != 0.0 ||
                                    ((NAN(dVar23) ||
                                     (dVar20 = *(double *)((long)&pAVar13[2].super_Point.z + lVar14)
                                     , dVar20 != 0.0)))) || (NAN(dVar20))))) &&
                                 (dVar22 = (pAVar7->super_Point).x - dVar22,
                                 dVar23 = (pAVar7->super_Point).y - dVar23,
                                 dVar20 = (pAVar7->super_Point).z -
                                          *(double *)((long)&pAVar13[2].super_Point.z + lVar14),
                                 dVar22 = dVar20 * dVar20 + dVar22 * dVar22 + dVar23 * dVar23,
                                 dVar22 <= 64.0)) {
                                dVar22 = SQRT(dVar22);
                                iVar5 = pAVar13[lVar11]._type;
                                iVar6 = *(int *)((long)&pAVar13[2]._type + lVar14);
                                sVar18 = sVar15;
                                if (sVar15 == 1) {
                                  sVar18 = sVar2;
                                }
                                if (sVar15 == 1 && sVar2 == 1) {
                                  if (iVar5 == 4) {
                                    if ((iVar6 != 0x10) || (dVar22 <= 2.7)) goto LAB_00116da9;
LAB_00116da2:
                                    if (3.3 <= dVar22) goto LAB_00116da9;
                                  }
                                  else {
                                    if (iVar5 == 0x10) {
                                      if (((iVar6 == 0x10) && (1.8 < dVar22)) && (dVar22 < 2.2))
                                      goto LAB_00116ddf;
                                      if ((iVar6 == 4) && (2.7 < dVar22)) goto LAB_00116da2;
                                    }
LAB_00116da9:
                                    dVar22 = dVar22 / (Atom::radius[iVar5] + Atom::radius[iVar6]);
                                    if (dVar22 <= 0.6) {
                                      if (0.5 <= dVar22) {
                                        local_f0 = iVar19 + 1;
                                        iVar19 = local_f0;
                                      }
                                      else {
                                        local_f0 = iVar19 + 5;
                                        iVar19 = local_f0;
                                      }
                                    }
                                  }
LAB_00116ddf:
                                  sVar18 = 1;
                                  sVar15 = 1;
                                  sVar16 = 1;
                                  sVar9 = 1;
                                }
                                else {
                                  dVar22 = dVar22 / (Atom::radius[iVar5] + Atom::radius[iVar6]);
                                  sVar15 = sVar18;
                                  sVar16 = sVar18;
                                  sVar9 = sVar18;
                                  if (dVar22 <= 0.6) {
                                    if (0.5 <= dVar22) {
                                      local_f0 = iVar19 + 1;
                                      iVar19 = local_f0;
                                    }
                                    else {
                                      local_f0 = iVar19 + 5;
                                      iVar19 = local_f0;
                                    }
                                  }
                                }
                              }
                            }
                            lVar14 = lVar14 + 0x50;
                          } while (lVar14 != 0xa0);
                        }
                      }
                      lVar11 = lVar11 + 1;
                    } while (lVar11 != local_c8->_numAtom);
                  }
                }
                else if (((int)uVar4 <= (int)uVar10) || (local_e0[local_d0] < (int)uVar4)) {
                  if (((int)uVar4 < (int)uVar10) && (local_58[local_d0] <= (int)uVar4)) {
                    local_b0 = (long)local_c8->_numAtom;
                    if (6 < local_b0) {
                      local_b8 = local_c8->_atom;
                      local_e8 = local_d8 + lVar11;
                      lVar11 = 6;
                      do {
                        if (local_b8[lVar11]._type < 0x16 && local_b8[lVar11]._type != -0x3039) {
                          pAVar13 = local_b8 + lVar11;
                          dVar22 = (pAVar13->super_Point).x;
                          if (((((dVar22 != 0.0) || (NAN(dVar22))) ||
                               (dVar22 = (pAVar13->super_Point).y, dVar22 != 0.0)) ||
                              (((NAN(dVar22) || (dVar22 = (pAVar13->super_Point).z, dVar22 != 0.0))
                               || (NAN(dVar22))))) && (0 < (long)local_e8->_numAtom)) {
                            dVar22 = ((Point *)&local_e8->_atom)->x;
                            local_a8 = (double *)&local_b8[lVar11]._type;
                            lVar14 = 0;
                            do {
                              iVar5 = *(int *)((long)dVar22 + 0x18 + lVar14);
                              lVar17 = (long)iVar5;
                              if (lVar17 != -0x3039 && lVar17 < 0x16) {
                                dVar23 = *(double *)((long)dVar22 + lVar14);
                                dVar20 = *(double *)((long)dVar22 + 8 + lVar14);
                                if ((((dVar23 != 0.0) || (NAN(dVar23))) ||
                                    ((dVar20 != 0.0 ||
                                     (((NAN(dVar20) ||
                                       (dVar21 = *(double *)((long)dVar22 + 0x10 + lVar14),
                                       dVar21 != 0.0)) || (NAN(dVar21))))))) &&
                                   (dVar23 = (pAVar13->super_Point).x - dVar23,
                                   dVar20 = (pAVar13->super_Point).y - dVar20,
                                   dVar21 = (pAVar13->super_Point).z -
                                            *(double *)((long)dVar22 + 0x10 + lVar14),
                                   dVar23 = dVar21 * dVar21 + dVar23 * dVar23 + dVar20 * dVar20,
                                   dVar23 <= 64.0)) {
                                  dVar23 = SQRT(dVar23);
                                  iVar6 = *(int *)local_a8;
                                  if ((sVar9 == 1) && (local_e8->_type == 1)) {
                                    if (iVar6 == 4) {
                                      if ((iVar5 != 0x10) || (dVar23 <= 2.7)) goto LAB_00117025;
LAB_0011701e:
                                      if (3.3 <= dVar23) goto LAB_00117025;
                                    }
                                    else {
                                      if (iVar6 == 0x10) {
                                        if (((iVar5 == 0x10) && (1.8 < dVar23)) && (dVar23 < 2.2))
                                        goto LAB_0011704a;
                                        if ((iVar5 == 4) && (2.7 < dVar23)) goto LAB_0011701e;
                                      }
LAB_00117025:
                                      dVar23 = dVar23 / (Atom::radius[iVar6] + Atom::radius[lVar17])
                                      ;
                                      if (dVar23 <= 0.6) {
                                        if (0.5 <= dVar23) {
                                          local_f0 = iVar19 + 1;
                                          iVar19 = local_f0;
                                        }
                                        else {
                                          local_f0 = iVar19 + 5;
                                          iVar19 = local_f0;
                                        }
                                      }
                                    }
LAB_0011704a:
                                    sVar16 = 1;
                                    sVar18 = 1;
                                  }
                                  else {
                                    dVar23 = dVar23 / (Atom::radius[iVar6] + Atom::radius[lVar17]);
                                    sVar16 = sVar9;
                                    sVar18 = sVar9;
                                    if (dVar23 <= 0.6) {
                                      if (0.5 <= dVar23) {
                                        local_f0 = iVar19 + 1;
                                        iVar19 = local_f0;
                                      }
                                      else {
                                        local_f0 = iVar19 + 5;
                                        iVar19 = local_f0;
                                      }
                                    }
                                  }
                                }
                              }
                              lVar14 = lVar14 + 0x50;
                            } while ((long)local_e8->_numAtom * 0x50 != lVar14);
                          }
                        }
                        lVar11 = lVar11 + 1;
                      } while (lVar11 != local_b0);
                    }
                  }
                  else {
                    local_c0 = (Residue *)(lVar11 * 0x150);
                    dVar22 = local_d8[lVar11]._center.super_Point.x;
                    dVar23 = local_d8[lVar11]._center.super_Point.y;
                    dVar24 = (local_60->super_Point).x - dVar22;
                    dVar21 = local_d8[(int)uVar10]._center.super_Point.y - dVar23;
                    dVar20 = local_d8[lVar11]._center.super_Point.z;
                    dVar25 = local_d8[(int)uVar10]._center.super_Point.z - dVar20;
                    sVar3 = local_d8[lVar11]._type;
                    if (((SQRT(dVar25 * dVar25 + dVar24 * dVar24 + dVar21 * dVar21) <
                          Residue::size[sVar18] + Residue::size[sVar3] + 5.5) ||
                        (dVar22 = (local_c8->_bbc).super_Point.x - dVar22,
                        dVar23 = (local_c8->_bbc).super_Point.y - dVar23,
                        dVar20 = (local_c8->_bbc).super_Point.z - dVar20,
                        SQRT(dVar20 * dVar20 + dVar22 * dVar22 + dVar23 * dVar23) <
                        Residue::size[sVar3] + Residue::bb_size + 5.5)) &&
                       (local_b8 = (Atom *)(long)local_c8->_numAtom, 6 < (long)local_b8)) {
                      local_c0 = local_d8 + lVar11;
                      local_e8 = (Residue *)local_c8->_atom;
                      local_b0 = CONCAT71(local_b0._1_7_,sVar3 != 1 || sVar16 != 1);
                      pAVar13 = (Atom *)0x6;
                      do {
                        if (*(int *)(local_e8->_scChi + (long)pAVar13 * 10 + -2) < 0x16 &&
                            *(int *)(local_e8->_scChi + (long)pAVar13 * 10 + -2) != -0x3039) {
                          pdVar1 = local_e8->_scChi + (long)pAVar13 * 10 + -5;
                          if (((((*pdVar1 != 0.0) || (NAN(*pdVar1))) ||
                               ((*(double *)(pdVar1 + 1) != 0.0 ||
                                ((NAN(*(double *)(pdVar1 + 1)) || (pdVar1[2] != 0.0)))))) ||
                              (NAN(pdVar1[2]))) && (0 < (long)local_c0->_numAtom)) {
                            pAVar7 = local_c0->_atom;
                            local_a8 = local_e8->_scChi + (long)pAVar13 * 10 + -2;
                            lVar11 = 0;
                            do {
                              iVar5 = *(int *)((long)&pAVar7->_type + lVar11);
                              lVar14 = (long)iVar5;
                              if (lVar14 != -0x3039 && lVar14 < 0x16) {
                                dVar22 = *(double *)((long)&(pAVar7->super_Point).x + lVar11);
                                dVar23 = *(double *)((long)&(pAVar7->super_Point).y + lVar11);
                                if ((((((dVar22 != 0.0) || (NAN(dVar22))) || (dVar23 != 0.0)) ||
                                     ((NAN(dVar23) ||
                                      (dVar20 = *(double *)((long)&(pAVar7->super_Point).z + lVar11)
                                      , dVar20 != 0.0)))) || (NAN(dVar20))) &&
                                   (dVar20 = pdVar1[2] -
                                             *(double *)((long)&(pAVar7->super_Point).z + lVar11),
                                   dVar22 = dVar20 * dVar20 +
                                            (*pdVar1 - dVar22) * (*pdVar1 - dVar22) +
                                            (*(double *)(pdVar1 + 1) - dVar23) *
                                            (*(double *)(pdVar1 + 1) - dVar23), dVar22 <= 64.0)) {
                                  dVar22 = SQRT(dVar22);
                                  iVar6 = *(int *)local_a8;
                                  if (sVar3 != 1 || sVar16 != 1) {
                                    dVar22 = dVar22 / (Atom::radius[iVar6] + Atom::radius[lVar14]);
                                    sVar18 = sVar16;
                                    if (dVar22 <= 0.6) {
                                      if (0.5 <= dVar22) {
                                        local_f0 = iVar19 + 1;
                                        iVar19 = local_f0;
                                      }
                                      else {
                                        local_f0 = iVar19 + 5;
                                        iVar19 = local_f0;
                                      }
                                    }
                                  }
                                  else {
                                    if (iVar6 == 4) {
                                      if (iVar5 == 0x10) {
joined_r0x0011731a:
                                        if ((2.7 < dVar22) && (sVar18 = 1, dVar22 < 3.3))
                                        goto LAB_0011735a;
                                      }
                                    }
                                    else if (iVar6 == 0x10) {
                                      if (((iVar5 == 0x10) && (1.8 < dVar22)) &&
                                         (sVar18 = 1, dVar22 < 2.2)) goto LAB_0011735a;
                                      if (iVar5 == 4) goto joined_r0x0011731a;
                                    }
                                    dVar22 = dVar22 / (Atom::radius[iVar6] + Atom::radius[lVar14]);
                                    sVar18 = 1;
                                    if (dVar22 <= 0.6) {
                                      if (0.5 <= dVar22) {
                                        local_f0 = iVar19 + 1;
                                        iVar19 = local_f0;
                                      }
                                      else {
                                        local_f0 = iVar19 + 5;
                                        iVar19 = local_f0;
                                      }
                                    }
                                  }
                                }
                              }
LAB_0011735a:
                              lVar11 = lVar11 + 0x50;
                            } while ((long)local_c0->_numAtom * 0x50 != lVar11);
                          }
                        }
                        pAVar13 = (Atom *)((long)&(pAVar13->super_Point).x + 1);
                      } while (pAVar13 != local_b8);
                    }
                  }
                }
                uVar12 = local_38 + 1;
              } while (local_38 + 1 != local_50);
              uVar12 = local_d0;
              conf = local_78;
              if (iVar19 != 0) {
                iVar8._M_current = *(int **)(local_80 + 8);
                if (iVar8._M_current == *(int **)(local_80 + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_80,iVar8,(int *)&local_ec);
                }
                else {
                  *iVar8._M_current = uVar10;
                  *(int **)(local_80 + 8) = iVar8._M_current + 1;
                }
                iVar8._M_current = *(int **)(this + 8);
                if (iVar8._M_current == *(int **)(this + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (this,iVar8,&local_f0);
                  uVar12 = local_d0;
                }
                else {
                  *iVar8._M_current = local_f0;
                  *(int **)(this + 8) = iVar8._M_current + 1;
                  uVar12 = local_d0;
                }
              }
            }
            local_e0 = (local_88->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
          }
          uVar10 = local_ec + 1;
        } while ((int)local_ec < local_e0[uVar12]);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != local_a0);
  }
  return;
}

Assistant:

void Clash_detection_list(const Structure &conf, const vector<int> &starts, const vector<int> &ends, vector<int> &ResIdx,
                          vector<int> &ClashNum, const std::vector<int> &List) {
    int i, p, j, l, k, t, clash_count = 0;
    double disquare, dis, r, quot = 0;

    const int List_size = static_cast<int>(List.size());

    const int n_starts = static_cast<int>(starts.size());

    for (t = 0; t < n_starts; t++) {
        for (l = starts[t]; l <= ends[t]; l++) {
            if (conf._res[l]._type == 0 || conf._res[l]._type == 5)
                continue;
            for (p = 0; p < List_size; p++) {
                i = List[p];

                if (i == l) {
                    for (j = NUM_BB_ATOM; j < conf._res[l]._numAtom; j++) {
                        // skip undefined and H atoms
                        if (conf._res[l]._atom[j]._type == UNDEF || conf._res[l]._atom[j]._type >= 22)
                            continue;
                        if (conf._res[l]._atom[j].x == 0 && conf._res[l]._atom[j].y == 0 &&
                            conf._res[l]._atom[j].z == 0)
                            continue;

                        for (k = 2; k <= 3; ++k) {
                            if (conf._res[i]._atom[k]._type == UNDEF || conf._res[i]._atom[k]._type >= 22) continue;
                            if (conf._res[i]._atom[k].x == 0 && conf._res[i]._atom[k].y == 0 &&
                                conf._res[i]._atom[k].z == 0)
                                continue;

                            disquare = (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x) *
                                       (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x)
                                       + (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y) *
                                         (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y)
                                       + (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z) *
                                         (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z);
                            if (disquare <= PF_DIS_CUT_SQUARE) {
                                dis = sqrt(disquare);
                                r = Atom::radius[conf._res[l]._atom[j]._type] +
                                    Atom::radius[conf._res[i]._atom[k]._type];
                                if (conf._res[l]._type == 1 && conf._res[i]._type == 1) {
                                    if ((conf._res[l]._atom[j]._type == 16) && (conf._res[i]._atom[k]._type == 16) &&
                                        (dis > 1.8 && dis < 2.2)) {
                                        continue;
                                    }
                                    else if (((conf._res[l]._atom[j]._type == 16 && conf._res[i]._atom[k]._type == 4) ||
                                              (conf._res[l]._atom[j]._type == 4 &&
                                               conf._res[i]._atom[k]._type == 16)) && (dis > 2.7 && dis < 3.3)) {
                                        continue;
                                    }
                                    else {
                                        quot = dis / r;
                                        if (quot <= VDW_CLASH_CUTOFF) {
                                            if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                                clash_count++;
                                            else {
                                                clash_count += 5;
                                            }
                                        }
                                    }
                                }
                                else {
                                    quot = dis / r;
                                    if (quot <= VDW_CLASH_CUTOFF) {
                                        if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                            clash_count++;
                                        else {
                                            clash_count += 5;
                                        }
                                    }
                                }
                            }
                        }
                    }

                }
                else if (i > l && i <= ends[t]) continue;
                else if (i >= starts[t] && i < l) {
                    for (j = NUM_BB_ATOM; j < conf._res[l]._numAtom; j++) {
                        // skip undefined and H atoms
                        if (conf._res[l]._atom[j]._type == UNDEF || conf._res[l]._atom[j]._type >= 22)
                            continue;
                        if (conf._res[l]._atom[j].x == 0 && conf._res[l]._atom[j].y == 0 &&
                            conf._res[l]._atom[j].z == 0)
                            continue;

                        for (k = 0; k < conf._res[i]._numAtom; ++k) {
                            if (conf._res[i]._atom[k]._type == UNDEF || conf._res[i]._atom[k]._type >= 22) continue;
                            if (conf._res[i]._atom[k].x == 0 && conf._res[i]._atom[k].y == 0 &&
                                conf._res[i]._atom[k].z == 0)
                                continue;

                            disquare = (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x) *
                                       (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x)
                                       + (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y) *
                                         (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y)
                                       + (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z) *
                                         (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z);
                            if (disquare <= PF_DIS_CUT_SQUARE) {
                                dis = sqrt(disquare);
                                r = Atom::radius[conf._res[l]._atom[j]._type] +
                                    Atom::radius[conf._res[i]._atom[k]._type];
                                if (conf._res[l]._type == 1 && conf._res[i]._type == 1) {
                                    if ((conf._res[l]._atom[j]._type == 16) && (conf._res[i]._atom[k]._type == 16) &&
                                        (dis > 1.8 && dis < 2.2)) {
                                        continue;
                                    }
                                    else if (((conf._res[l]._atom[j]._type == 16 && conf._res[i]._atom[k]._type == 4) ||
                                              (conf._res[l]._atom[j]._type == 4 &&
                                               conf._res[i]._atom[k]._type == 16)) && (dis > 2.7 && dis < 3.3)) {
                                        continue;
                                    }
                                    else {
                                        quot = dis / r;
                                        if (quot <= VDW_CLASH_CUTOFF) {
                                            if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                                clash_count++;
                                            else {
                                                clash_count += 5;
                                            }
                                        }
                                    }
                                }
                                else {
                                    quot = dis / r;
                                    if (quot <= VDW_CLASH_CUTOFF) {
                                        if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                            clash_count++;
                                        else {
                                            clash_count += 5;
                                        }
                                    }
                                }
                            }
                        }
                    }

                }
                else {
                    if ((conf._res[l]._center.dis(conf._res[i]._center) <
                         Residue::size[conf._res[l]._type] + Residue::size[conf._res[i]._type] + CUB_SIZE) ||
                        (conf._res[l]._bbc.dis(conf._res[i]._center) <
                         Residue::bb_size + Residue::size[conf._res[i]._type] + CUB_SIZE)) {
                        for (j = NUM_BB_ATOM; j < conf._res[l]._numAtom; j++) {
                            // skip undefined and H atoms
                            if (conf._res[l]._atom[j]._type == UNDEF || conf._res[l]._atom[j]._type >= 22)
                                continue;
                            if (conf._res[l]._atom[j].x == 0 && conf._res[l]._atom[j].y == 0 &&
                                conf._res[l]._atom[j].z == 0)
                                continue;
                            for (k = 0; k < conf._res[i]._numAtom; ++k) {
                                if (conf._res[i]._atom[k]._type == UNDEF || conf._res[i]._atom[k]._type >= 22) continue;
                                if (conf._res[i]._atom[k].x == 0 && conf._res[i]._atom[k].y == 0 &&
                                    conf._res[i]._atom[k].z == 0)
                                    continue;

                                disquare = (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x) *
                                           (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x)
                                           + (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y) *
                                             (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y)
                                           + (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z) *
                                             (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z);
                                if (disquare <= PF_DIS_CUT_SQUARE) {
                                    dis = sqrt(disquare);
                                    r = Atom::radius[conf._res[l]._atom[j]._type] +
                                        Atom::radius[conf._res[i]._atom[k]._type];
                                    if (conf._res[l]._type == 1 && conf._res[i]._type == 1) {
                                        if ((conf._res[l]._atom[j]._type == 16) &&
                                            (conf._res[i]._atom[k]._type == 16) && (dis > 1.8 && dis < 2.2)) {
                                            continue;
                                        }
                                        else if (((conf._res[l]._atom[j]._type == 16 &&
                                                   conf._res[i]._atom[k]._type == 4) ||
                                                  (conf._res[l]._atom[j]._type == 4 &&
                                                   conf._res[i]._atom[k]._type == 16)) && (dis > 2.7 && dis < 3.3)) {
                                            continue;
                                        }
                                        else {
                                            quot = dis / r;
                                            if (quot <= VDW_CLASH_CUTOFF) {
                                                if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                                    clash_count++;
                                                else {
                                                    clash_count += 5;
                                                }
                                            }
                                        }
                                    }
                                    else {
                                        quot = dis / r;
                                        if (quot <= VDW_CLASH_CUTOFF) {
                                            if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                                clash_count++;
                                            else {
                                                clash_count += 5;
                                            }
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }
            if (clash_count != 0) {
                ResIdx.push_back(l);
                ClashNum.push_back(clash_count);
            }
            clash_count = 0;
        }
    }
}